

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int growVTrans(sqlite3 *db)

{
  void *pvVar1;
  long in_RDI;
  sqlite3_int64 nBytes;
  VTable **aVTrans;
  int ARRAY_INCR;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (*(int *)(in_RDI + 0x21c) % 5 == 0) {
    pvVar1 = sqlite3DbRealloc((sqlite3 *)CONCAT44(5,in_stack_ffffffffffffffe8),&DAT_aaaaaaaaaaaaaaaa
                              ,((long)*(int *)(in_RDI + 0x21c) + 5) * 8);
    if (pvVar1 == (void *)0x0) {
      return 7;
    }
    memset((void *)((long)pvVar1 + (long)*(int *)(in_RDI + 0x21c) * 8),0,0x28);
    *(void **)(in_RDI + 0x240) = pvVar1;
  }
  return 0;
}

Assistant:

static int growVTrans(sqlite3 *db){
  const int ARRAY_INCR = 5;

  /* Grow the sqlite3.aVTrans array if required */
  if( (db->nVTrans%ARRAY_INCR)==0 ){
    VTable **aVTrans;
    sqlite3_int64 nBytes = sizeof(sqlite3_vtab*)*
                                 ((sqlite3_int64)db->nVTrans + ARRAY_INCR);
    aVTrans = sqlite3DbRealloc(db, (void *)db->aVTrans, nBytes);
    if( !aVTrans ){
      return SQLITE_NOMEM_BKPT;
    }
    memset(&aVTrans[db->nVTrans], 0, sizeof(sqlite3_vtab *)*ARRAY_INCR);
    db->aVTrans = aVTrans;
  }

  return SQLITE_OK;
}